

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O3

int h264_residual_cavlc(bitstream *str,h264_slice *slice,int32_t *block,int *num,int cat,int idx,
                       int start,int end,int maxnumcoeff)

{
  long lVar1;
  bitstream *pbVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t mode;
  int iVar7;
  int iVar8;
  uint32_t in_R11D;
  uint32_t uVar9;
  uint uVar10;
  uint32_t *puVar11;
  long lVar12;
  uint32_t *val;
  bool bVar13;
  uint32_t auStack_70 [2];
  h264_slice *local_68;
  uint32_t *local_60;
  uint local_54;
  bitstream *pbStack_50;
  uint32_t s;
  uint32_t local_48;
  int local_44;
  h264_slice **local_40;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t trailing_ones;
  uint32_t total_coeff;
  
  uVar4 = (ulong)(uint)maxnumcoeff * 4 + 0xf & 0xfffffffffffffff0;
  lVar1 = -0x68 - uVar4;
  puVar11 = (uint32_t *)((long)&local_68 + (lVar1 - uVar4) + 0x68);
  local_68 = slice;
  pbStack_50 = str;
  local_44 = cat;
  if (str->dir == VS_ENCODE) {
    local_34 = 0;
    local_38 = 0;
    if (0 < maxnumcoeff) {
      uVar4 = 0;
      uVar6 = 0;
      uVar10 = 0;
      do {
        if (block[uVar4] != 0) {
          if (((long)uVar4 < (long)start) || ((long)end < (long)uVar4)) {
            local_40 = &local_68;
            puVar11[-2] = 0x104b8f;
            puVar11[-1] = 0;
            h264_residual_cavlc_cold_1();
            return 1;
          }
          uVar10 = uVar10 + 1;
          if ((block[uVar4] + 1U & 0xfffffffd) != 0) {
            uVar10 = 0;
          }
          in_R11D = ((int)uVar4 - start) - uVar6;
          uVar6 = uVar6 + 1;
          local_38 = uVar10;
          local_34 = uVar6;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)maxnumcoeff != uVar4);
      local_48 = in_R11D;
      local_40 = &local_68;
      if (0 < maxnumcoeff) {
        iVar3 = uVar6 - 1;
        uVar5 = (ulong)(start - 1);
        uVar4 = 0;
        local_40 = &local_68;
        do {
          iVar8 = block[uVar4];
          if (iVar8 != 0) {
            puVar11[iVar3] = ~(uint)uVar5 + (int)uVar4;
            *(int *)((long)&local_68 + (long)iVar3 * 4 + lVar1 + 0x68) = iVar8;
            iVar3 = iVar3 + -1;
            uVar5 = uVar4 & 0xffffffff;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)maxnumcoeff != uVar4);
      }
      if (3 < uVar10) {
        local_38 = 3;
      }
    }
  }
  iVar3 = local_44;
  pbVar2 = pbStack_50;
  puVar11[-2] = 0x104899;
  puVar11[-1] = 0;
  iVar3 = h264_coeff_token(pbVar2,slice,iVar3,idx,&local_38,&local_34);
  iVar8 = 1;
  if (iVar3 == 0) {
    if (num != (int *)0x0) {
      *num = local_34;
    }
    local_60 = puVar11;
    if (local_34 == 0) {
      uVar10 = 0xffffffff;
    }
    else {
      local_40 = &local_68;
      uVar10 = (uint)(local_38 < 3 && 10 < local_34);
      lVar12 = 0;
      uVar4 = 0;
      do {
        pbVar2 = pbStack_50;
        uVar5 = (ulong)local_38;
        if (uVar4 < uVar5) {
          local_54 = *(uint *)((long)&local_68 + uVar4 * 4 + lVar1 + 0x68) >> 0x1f;
          puVar11[-2] = 0x1049e4;
          puVar11[-1] = 0;
          iVar3 = vs_u(pbVar2,&local_54,1);
          if (iVar3 != 0) {
            return 1;
          }
          *(uint *)((long)&local_68 + uVar4 * 4 + lVar1 + 0x68) = local_54 * -2 + 1;
        }
        else {
          bVar13 = local_38 < 3;
          puVar11[-2] = 0x104a18;
          puVar11[-1] = 0;
          iVar3 = h264_level(pbVar2,uVar10,(uint)(bVar13 && uVar4 == uVar5),
                             (int32_t *)((long)&local_68 + lVar12 + lVar1 + 0x68));
          if (iVar3 != 0) {
            return 1;
          }
          iVar7 = uVar10 + (uVar10 == 0);
          iVar3 = *(int *)((long)&local_68 + uVar4 * 4 + lVar1 + 0x68);
          iVar8 = -iVar3;
          if (0 < iVar3) {
            iVar8 = iVar3;
          }
          uVar10 = (uint)(iVar7 < 6 && 3 << ((char)iVar7 - 1U & 0x1f) < iVar8) + iVar7;
        }
        uVar9 = local_34;
        pbVar2 = pbStack_50;
        val = local_60;
        uVar4 = uVar4 + 1;
        lVar12 = lVar12 + 4;
      } while (uVar4 < local_34);
      mode = 0;
      if (local_44 == 3) {
        mode = local_68->chroma_array_type;
      }
      if (local_34 < (end - start) + 1U) {
        puVar11[-2] = 0x104a9f;
        puVar11[-1] = 0;
        iVar3 = h264_total_zeros(pbVar2,mode,uVar9,&local_48);
      }
      else {
        puVar11[-2] = 0x104b14;
        puVar11[-1] = 0;
        iVar3 = vs_infer(pbVar2,&local_48,0);
      }
      if (iVar3 != 0) {
        return 1;
      }
      uVar9 = local_48;
      if (local_34 == 1) {
        uVar10 = 0;
        uVar5 = 0;
      }
      else {
        uVar4 = 0;
        do {
          pbVar2 = pbStack_50;
          puVar11[-2] = 0x104b4a;
          puVar11[-1] = 0;
          iVar3 = h264_run_before(pbVar2,uVar9,val);
          if (iVar3 != 0) {
            return 1;
          }
          uVar9 = uVar9 - *val;
          if ((int)uVar9 < 0) {
            puVar11[-2] = 0x104ba3;
            puVar11[-1] = 0;
            h264_residual_cavlc_cold_2();
            return 1;
          }
          uVar4 = uVar4 + 1;
          uVar10 = local_34 - 1;
          uVar5 = (ulong)uVar10;
          val = val + 1;
        } while (uVar4 < uVar5);
      }
      local_60[uVar5] = uVar9;
    }
    iVar8 = 0;
    if (pbStack_50->dir == VS_DECODE) {
      if (0 < maxnumcoeff) {
        puVar11[-2] = 0x104ac9;
        puVar11[-1] = 0;
        memset(block,0,(ulong)(uint)maxnumcoeff * 4);
      }
      iVar8 = 0;
      if (-1 < (int)uVar10) {
        uVar4 = (ulong)uVar10;
        iVar3 = -1;
        do {
          iVar7 = iVar3 + local_60[uVar4];
          iVar3 = iVar3 + local_60[uVar4] + 1;
          block[iVar7 + start + 1] = *(int32_t *)((long)&local_68 + uVar4 * 4 + lVar1 + 0x68);
          bVar13 = uVar4 != 0;
          uVar4 = uVar4 - 1;
        } while (bVar13);
      }
    }
  }
  return iVar8;
}

Assistant:

int h264_residual_cavlc(struct bitstream *str, struct h264_slice *slice, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff) {
	uint32_t total_coeff, trailing_ones;
	int i, j;
	int32_t tb[maxnumcoeff];
	uint32_t run[maxnumcoeff];
	int last;
	uint32_t total_zeros;
	if (str->dir == VS_ENCODE) {
		total_coeff = 0;
		trailing_ones = 0;
		for (i = 0; i < maxnumcoeff; i++)
			if (block[i]) {
				if (i < start || i > end) {
					fprintf(stderr, "Non-zero coord outside of start..end\n");
					return 1;
				}
				total_coeff++;
				if (abs(block[i]) == 1)
					trailing_ones++;
				else
					trailing_ones = 0;
				total_zeros = i + 1 - total_coeff - start;
			}
		last = start - 1;
		for (i = 0, j = total_coeff - 1; i < maxnumcoeff; i++) {
			if (block[i]) {
				run[j] = i - last - 1;
				tb[j] = block[i];
				last = i;
				j--;
			}
		}
		if (trailing_ones > 3)
			trailing_ones = 3;
	}
	if (h264_coeff_token(str, slice, cat, idx, &trailing_ones, &total_coeff)) return 1;
	if (num)
		*num = total_coeff;
	if (total_coeff) {
		int suffixLength;
		if (total_coeff > 10 && trailing_ones < 3)
			suffixLength = 1;
		else
			suffixLength = 0;
		for (i = 0; i < total_coeff; i++) {
			if (i < trailing_ones) {
				uint32_t s = tb[i] < 0;
				if (vs_u(str, &s, 1)) return 1;
				tb[i] = 1 - 2 * s;
			} else {
				int onebias = (i == trailing_ones && trailing_ones < 3);
				if (h264_level(str, suffixLength, onebias, &tb[i])) return 1;
				if (suffixLength == 0)
					suffixLength = 1;
				if (abs(tb[i]) > (3 << (suffixLength - 1)) && suffixLength < 6)
					suffixLength++;
			}
		}
		int mode;
		if (cat == H264_CTXBLOCKCAT_CHROMA_DC) {
			mode = slice->chroma_array_type;
		} else {
			mode = 0;
		}
		if (total_coeff < end - start + 1) {
			if (h264_total_zeros(str, mode, total_coeff, &total_zeros)) return 1;
		} else {
			if (vs_infer(str, &total_zeros, 0)) return 1;
		}
		int zerosLeft = total_zeros;
		for (i = 0; i < total_coeff - 1; i++) {
			if (h264_run_before(str, zerosLeft, &run[i])) return 1;
			zerosLeft -= run[i];
			if (zerosLeft < 0) {
				fprintf(stderr, "zerosLeft underflow\n");
				return 1;
			}
		}
		run[total_coeff-1] = zerosLeft;
	}
	if (str->dir == VS_DECODE) {
		for (i = 0; i < maxnumcoeff; i++)
			block[i] = 0;
		for (i = total_coeff - 1, j = -1; i >= 0; i--) {
			j += run[i] + 1;
			block[start + j] = tb[i];
		}
	}
	return 0;
}